

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cqm.cpp
# Opt level: O1

bool ReadCQM(MemFile *file,shared_ptr<Disk> *disk)

{
  char *pcVar1;
  basic_ostream<char,_std::char_traits<char>_> *__os;
  byte bVar2;
  element_type *peVar3;
  char *pcVar4;
  char *pcVar5;
  undefined2 uVar6;
  char extraout_AL;
  char cVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  value_type_conflict3 *__val;
  ssize_t sVar11;
  Data *pDVar12;
  mapped_type *pmVar13;
  long lVar14;
  byte *pbVar15;
  exception *peVar16;
  uint uVar17;
  size_t in_RCX;
  pointer puVar18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__nbytes;
  int iVar19;
  pointer puVar20;
  uint32_t value;
  DataRate DVar21;
  FILE *__stream;
  byte *pbVar22;
  int iVar23;
  long *in_FS_OFFSET;
  _Put_time<char> __f;
  Data data;
  string label;
  uint16_t ulen;
  string desc;
  CQM_HEADER dh;
  Data block;
  Format fmt;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_338;
  string local_318;
  undefined1 local_2f8 [20];
  int iStack_2e4;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  long lStack_2d0;
  char *local_2c8;
  key_type local_2c0;
  short local_29d;
  char local_29b;
  ushort local_29a;
  undefined2 local_28d;
  undefined2 local_28b;
  undefined8 local_281;
  undefined8 uStack_279;
  undefined8 local_271;
  undefined8 uStack_269;
  undefined8 local_261;
  undefined4 uStack_259;
  undefined4 uStack_255;
  undefined4 uStack_251;
  undefined8 uStack_24d;
  byte local_245;
  char local_244;
  byte local_243;
  byte local_242;
  byte local_241 [4];
  undefined7 local_23d;
  undefined4 uStack_236;
  undefined2 local_232;
  undefined2 local_230;
  ushort local_22e;
  char local_22c;
  byte abStack_22b [4];
  byte local_227;
  byte abStack_226 [14];
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [7];
  ios_base local_198 [264];
  long *local_90 [2];
  long local_80 [2];
  Format local_6c;
  
  __stream = (FILE *)0x0;
  memset(&local_29d,0,0x85);
  MemFile::rewind(file,__stream);
  if (extraout_AL == '\0') {
    return false;
  }
  sVar11 = MemFile::read(file,(int)&local_29d,(void *)0x85,in_RCX);
  if (((char)sVar11 == '\0') || (local_29b != '\x14' || local_29d != 0x5143)) {
    return false;
  }
  pDVar12 = MemFile::data(file);
  puVar20 = (pDVar12->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  pDVar12 = MemFile::data(file);
  puVar18 = (pDVar12->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start + 0x85;
  if (puVar20 != puVar18) {
    cVar7 = '\0';
    do {
      cVar7 = cVar7 + *puVar20;
      puVar20 = puVar20 + 1;
    } while (puVar20 != puVar18);
    if (cVar7 != '\0') {
      peVar16 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[20]>(peVar16,(char (*) [20])"bad header checksum");
      __cxa_throw(peVar16,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  local_6c.fdc = PC;
  local_6c.head0 = 0;
  local_6c.head1 = 1;
  iVar23 = 0;
  local_6c.gap3 = 0;
  DVar21 = _250K;
  if (local_244 == '\x01') {
    DVar21 = _500K;
  }
  local_6c.datarate = _1M;
  if (local_244 != '\x02') {
    local_6c.datarate = DVar21;
  }
  local_6c._32_8_ = (ulong)(byte)(abStack_22b[2] + (abStack_22b[2] == '\0')) << 0x20;
  local_6c.skew = (int)abStack_22b[3];
  local_6c.base._0_1_ = local_22c + '\x01';
  local_6c.size = 2;
  local_6c.base._1_3_ = 0;
  local_6c.fill = 0xe5;
  if (local_245 != 0) {
    local_6c.fill = 0;
  }
  local_6c.cyls_first = false;
  local_6c.heads._0_2_ = local_28b;
  local_6c.cyls = (uint)local_242;
  local_6c.heads._2_2_ = 0;
  local_6c.sectors._0_2_ = local_28d;
  local_6c.encoding = 1;
  local_6c.sectors._2_2_ = 0;
  iVar9 = SizeToCode((uint)local_29a);
  local_6c.size = iVar9;
  Format::Validate(&local_6c);
  if ((ulong)local_22e != 0) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_318,(ulong)local_22e,
               (allocator_type *)local_218);
    iVar19 = (int)local_318._M_string_length - (int)local_318._M_dataplus._M_p;
    iVar9 = MemFile::remaining(file);
    if (iVar9 < iVar19) {
      peVar16 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[27]>
                (peVar16,(char (*) [27])"short file reading comment");
      __cxa_throw(peVar16,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    memcpy(local_318._M_dataplus._M_p,(file->m_it)._M_current,(long)iVar19);
    (file->m_it)._M_current = (file->m_it)._M_current + iVar19;
    local_2f8._0_8_ = local_2f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2f8,local_318._M_dataplus._M_p,local_318._M_string_length);
    util::trim((string *)local_218,(string *)local_2f8);
    peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"comment","");
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&peVar3->metadata,&local_2c0);
    std::__cxx11::string::operator=((string *)pmVar13,(string *)local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
      operator_delete((void *)local_218._0_8_,
                      CONCAT17(local_208[0]._M_local_buf[7],
                               (undefined7)local_208[0]._M_allocated_capacity) + 1);
    }
    if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
      operator_delete((void *)local_2f8._0_8_,stack0xfffffffffffffd18 + 1);
    }
    if (local_318._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_318._M_dataplus._M_p,
                      local_318.field_2._M_allocated_capacity - (long)local_318._M_dataplus._M_p);
    }
  }
  lVar14 = 0;
  do {
    __nbytes = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)abStack_22b[lVar14];
    iVar23 = iVar23 + (uint)abStack_22b[lVar14];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 2);
  if (iVar23 == 0) {
    lVar14 = 0;
    __nbytes = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
    do {
      uVar17 = (int)__nbytes + (uint)abStack_226[lVar14];
      __nbytes = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(ulong)uVar17;
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0xd);
    if (uVar17 == 0) goto LAB_00185172;
  }
  Message<>(msgWarning,"unused header fields contain non-zero values");
LAB_00185172:
  local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (byte *)0x0;
  local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar23 = Format::disk_size(&local_6c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&local_338,(long)iVar23);
  iVar23 = Format::track_size(&local_6c);
  iVar9 = iVar23 * (uint)local_243 * local_6c.heads;
  iVar23 = (int)local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
           (int)local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (iVar23 < iVar9) {
    do {
      sVar11 = MemFile::read(file,(int)local_2f8,(void *)0x2,(size_t)__nbytes);
      if ((char)sVar11 == '\0') {
        peVar16 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[29]>
                  (peVar16,(char (*) [29])"short file reading disk data");
        __cxa_throw(peVar16,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar6 = local_2f8._0_2_;
      if ((long)(short)local_2f8._0_2_ < 1) {
        local_218._0_8_ = local_218._0_8_ & 0xffffffffffffff00;
        MemFile::read(file,(int)(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218,
                      (void *)0x1,(size_t)__nbytes);
        __nbytes = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
                  (&local_338,
                   (iterator)
                   local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(ulong)(uint)-(int)(short)uVar6,
                   (value_type *)local_218);
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218,
                   (long)(short)local_2f8._0_2_,(allocator_type *)&local_2c0);
        iVar19 = (int)local_218._8_8_ - (int)local_218._0_8_;
        iVar23 = MemFile::remaining(file);
        if (iVar19 <= iVar23) {
          memcpy((void *)local_218._0_8_,(file->m_it)._M_current,(long)iVar19);
          (file->m_it)._M_current = (file->m_it)._M_current + iVar19;
        }
        __nbytes = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_218._8_8_;
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_338,
                   local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,local_218._0_8_);
        if ((pointer)local_218._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_218._0_8_,
                          CONCAT17(local_208[0]._M_local_buf[7],
                                   (undefined7)local_208[0]._M_allocated_capacity) - local_218._0_8_
                         );
        }
      }
      iVar23 = (int)local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
               (int)local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    } while (iVar23 < iVar9);
  }
  pbVar22 = local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar14 = 0;
  pbVar15 = local_241;
  uVar17 = 0;
  do {
    uVar17 = uVar17 | (uint)*pbVar15 << ((byte)lVar14 & 0x1f);
    lVar14 = lVar14 + 8;
    pbVar15 = pbVar15 + 1;
  } while (lVar14 != 0x20);
  if ((crc32(unsigned_char_const*,int,unsigned_int)::crc_table == '\0') &&
     (iVar9 = __cxa_guard_acquire(&crc32(unsigned_char_const*,int,unsigned_int)::crc_table),
     iVar9 != 0)) {
    crc32(unsigned_char_const*,int,unsigned_int)::crc_table = (void *)0x0;
    _DAT_001e02f8 = (void *)0x0;
    _DAT_001e0300 = 0;
    crc32(unsigned_char_const*,int,unsigned_int)::crc_table = operator_new(0x100);
    lVar14 = (long)crc32(unsigned_char_const*,int,unsigned_int)::crc_table + 0x100;
    _DAT_001e02f8 = crc32(unsigned_char_const*,int,unsigned_int)::crc_table;
    _DAT_001e0300 = lVar14;
    memset(crc32(unsigned_char_const*,int,unsigned_int)::crc_table,0,0x100);
    _DAT_001e02f8 = (void *)lVar14;
    __cxa_atexit(std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector,
                 &crc32(unsigned_char_const*,int,unsigned_int)::crc_table,&__dso_handle);
    __cxa_guard_release(&crc32(unsigned_char_const*,int,unsigned_int)::crc_table);
  }
  local_218._0_8_ = local_2f8;
  *in_FS_OFFSET = (long)local_218;
  *in_FS_OFFSET =
       (long)std::once_flag::_Prepare_execution::
             _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
             ::anon_class_1_0_00000001::__invoke;
  iVar9 = pthread_once(&crc32(unsigned_char_const*,int,unsigned_int)::flag,__once_proxy);
  if (iVar9 == 0) {
    uVar10 = 0;
    *in_FS_OFFSET = 0;
    *in_FS_OFFSET = 0;
    if (0 < iVar23) {
      iVar23 = iVar23 + 1;
      uVar10 = 0;
      do {
        bVar2 = *pbVar22;
        pbVar22 = pbVar22 + 1;
        uVar10 = uVar10 >> 8 ^
                 *(uint *)((long)crc32(unsigned_char_const*,int,unsigned_int)::crc_table +
                          (ulong)((bVar2 ^ uVar10) & 0x3f) * 4);
        iVar23 = iVar23 + -1;
      } while (1 < iVar23);
    }
    if (uVar10 == uVar17) {
      bVar8 = MemFile::eof(file);
      if (!bVar8) {
        Message<>(msgWarning,"extra data found at end of file");
      }
      pcVar1 = local_218 + 0x10;
      local_2f8._0_8_ = (pointer)0x3c;
      local_218._0_8_ = pcVar1;
      local_218._0_8_ = std::__cxx11::string::_M_create((ulong *)local_218,(ulong)local_2f8);
      local_208[0]._M_allocated_capacity._0_7_ = (undefined7)local_2f8._0_8_;
      local_208[0]._M_local_buf[7] = SUB81(local_2f8._0_8_,7);
      *(ulong *)(local_218._0_8_ + 0x2c) = CONCAT44(uStack_251,uStack_255);
      *(undefined8 *)(local_218._0_8_ + 0x34) = uStack_24d;
      *(undefined8 *)(local_218._0_8_ + 0x20) = local_261;
      *(ulong *)(local_218._0_8_ + 0x28) = CONCAT44(uStack_255,uStack_259);
      *(undefined8 *)(local_218._0_8_ + 0x10) = local_271;
      *(undefined8 *)(local_218._0_8_ + 0x18) = uStack_269;
      *(undefined8 *)local_218._0_8_ = local_281;
      *(undefined8 *)(local_218._0_8_ + 8) = uStack_279;
      local_218._8_8_ = local_2f8._0_8_;
      *(char *)(local_218._0_8_ + local_2f8._0_8_) = '\0';
      util::trim(&local_2c0,(string *)local_218);
      if ((char *)local_218._0_8_ != pcVar1) {
        operator_delete((void *)local_218._0_8_,
                        CONCAT17(local_208[0]._M_local_buf[7],
                                 (undefined7)local_208[0]._M_allocated_capacity) + 1);
      }
      if (local_2c0._M_string_length != 0) {
        peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_218._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"description","");
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar3->metadata,(key_type *)local_218);
        std::__cxx11::string::_M_assign((string *)pmVar13);
        if ((char *)local_218._0_8_ != pcVar1) {
          operator_delete((void *)local_218._0_8_,
                          CONCAT17(local_208[0]._M_local_buf[7],
                                   (undefined7)local_208[0]._M_allocated_capacity) + 1);
        }
      }
      local_208[0]._M_allocated_capacity._0_7_ = local_23d;
      local_208[0]._7_4_ = uStack_236;
      local_218._8_8_ = (pointer)0xb;
      local_208[0]._M_local_buf[0xb] = '\0';
      local_218._0_8_ = pcVar1;
      util::trim(&local_318,(string *)local_218);
      if ((char *)local_218._0_8_ != pcVar1) {
        operator_delete((void *)local_218._0_8_,
                        CONCAT17(local_208[0]._M_local_buf[7],
                                 (undefined7)local_208[0]._M_allocated_capacity) + 1);
      }
      if ((local_318._M_string_length != 0) &&
         (iVar23 = std::__cxx11::string::compare((char *)&local_318), iVar23 != 0)) {
        peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_218._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"label","");
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar3->metadata,(key_type *)local_218);
        std::__cxx11::string::_M_assign((string *)pmVar13);
        if ((char *)local_218._0_8_ != pcVar1) {
          operator_delete((void *)local_218._0_8_,
                          CONCAT17(local_208[0]._M_local_buf[7],
                                   (undefined7)local_208[0]._M_allocated_capacity) + 1);
        }
      }
      if (local_242 != local_243) {
        uVar17 = 1;
        if (9 < local_243) {
          uVar17 = 3 - (local_243 < 100);
        }
        local_218._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct((ulong)local_218,(char)uVar17);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_218._0_8_,uVar17,(uint)local_243);
        peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_2f8._0_8_ = local_2f8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"used_cyls","");
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar3->metadata,(key_type *)local_2f8);
        std::__cxx11::string::operator=((string *)pmVar13,(string *)local_218);
        if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
          operator_delete((void *)local_2f8._0_8_,stack0xfffffffffffffd18 + 1);
        }
        if ((char *)local_218._0_8_ != pcVar1) {
          operator_delete((void *)local_218._0_8_,
                          CONCAT17(local_208[0]._M_local_buf[7],
                                   (undefined7)local_208[0]._M_allocated_capacity) + 1);
        }
      }
      if ((ulong)local_245 < 3) {
        pcVar4 = ReadCQM::read_modes[local_245];
        peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_218._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"read_mode","");
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar3->metadata,(key_type *)local_218);
        pcVar5 = (char *)pmVar13->_M_string_length;
        strlen(pcVar4);
        std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar5,(ulong)pcVar4);
        if ((char *)local_218._0_8_ != pcVar1) {
          operator_delete((void *)local_218._0_8_,
                          CONCAT17(local_208[0]._M_local_buf[7],
                                   (undefined7)local_208[0]._M_allocated_capacity) + 1);
        }
      }
      if ((byte)(local_227 - 1) < 6) {
        pcVar4 = ReadCQM::drv_types[local_227 - 1];
        peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_218._0_8_ = pcVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"drive","");
        pmVar13 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&peVar3->metadata,(key_type *)local_218);
        pcVar5 = (char *)pmVar13->_M_string_length;
        strlen(pcVar4);
        std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar5,(ulong)pcVar4);
        if ((char *)local_218._0_8_ != pcVar1) {
          operator_delete((void *)local_218._0_8_,
                          CONCAT17(local_208[0]._M_local_buf[7],
                                   (undefined7)local_208[0]._M_allocated_capacity) + 1);
        }
      }
      uStack_2e0 = 0;
      lStack_2d0 = 0;
      local_2c8 = (char *)0x0;
      iStack_2e4 = (local_230._1_1_ >> 1) + 0x50;
      local_2f8._16_4_ = (local_230 >> 5 & 0xf) - 1;
      local_2f8._8_8_ =
           (ulong)CONCAT14((undefined1)local_230,(uint)(local_232._1_1_ >> 3)) & 0x1fffffffff;
      local_2f8._0_8_ =
           (ulong)CONCAT24(local_232 >> 5,(uint)(byte)local_232 + (uint)(byte)local_232) &
           0x3f0000003e;
      local_2d8._0_4_ = -1;
      local_2d8._4_4_ = 0;
      std::__cxx11::stringstream::stringstream((stringstream *)local_218);
      __os = (basic_ostream<char,_std::char_traits<char>_> *)(local_218 + 0x10);
      __f._M_fmt = "%Y-%m-%d %T";
      __f._M_tmb = (tm *)local_2f8;
      std::operator<<(__os,__f);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream((stringstream *)local_218);
      std::ios_base::~ios_base(local_198);
      peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_218._0_8_ = __os;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"created","");
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](&peVar3->metadata,(key_type *)local_218);
      std::__cxx11::string::operator=((string *)pmVar13,(string *)local_90);
      if ((basic_ostream<char,_std::char_traits<char>_> *)local_218._0_8_ != __os) {
        operator_delete((void *)local_218._0_8_,
                        CONCAT17(local_208[0]._M_local_buf[7],
                                 (undefined7)local_208[0]._M_allocated_capacity) + 1);
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],local_80[0] + 1);
      }
      iVar23 = Format::disk_size(&local_6c);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&local_338,(long)iVar23,&local_6c.fill);
      Disk::format((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,&local_6c,
                   (Data *)&local_338,false);
      peVar3 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__cxx11::string::_M_replace
                ((ulong)&peVar3->strType,0,(char *)(peVar3->strType)._M_string_length,0x1b0cda);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
        operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
      }
      if (local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (byte *)0x0) {
        operator_delete(local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_338.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_338.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      return true;
    }
  }
  else {
    std::__throw_system_error(iVar9);
  }
  peVar16 = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<char_const(&)[17]>(peVar16,(char (*) [17])"invalid data crc");
  __cxa_throw(peVar16,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool ReadCQM(MemFile& file, std::shared_ptr<Disk>& disk)
{
    CQM_HEADER dh{};
    if (!file.rewind() || !file.read(&dh, sizeof(dh)))
        return false;

    if (memcmp(&dh.sig, CQM_SIGNATURE, sizeof(dh.sig)))
        return false;

    auto header_checksum = std::accumulate(
        file.data().begin(), file.data().begin() + sizeof(dh), 0);
    if (header_checksum & 0xff)
        throw util::exception("bad header checksum");

    Format fmt;
    fmt.fdc = FdcType::PC;
    fmt.encoding = Encoding::MFM;
    fmt.datarate = (dh.density == 2) ? DataRate::_1M :
        (dh.density == 1) ? DataRate::_500K : DataRate::_250K;
    fmt.interleave = (dh.interleave <= 1) ? 1 : dh.interleave;
    fmt.skew = dh.skew;
    fmt.base = (dh.sector_base + 1) & 0xff;
    fmt.fill = (dh.read_mode == 0) ? 0xe5 : 0x00;
    fmt.cyls = dh.cyls;
    fmt.heads = util::le_value(dh.heads);
    fmt.sectors = util::le_value(dh.sec_per_track);
    fmt.size = SizeToCode(util::le_value(dh.sector_size));
    fmt.Validate();

    int comment_len = util::le_value(dh.comment_len);
    if (comment_len)
    {
        std::vector<char> comment(comment_len);
        if (!file.read(comment))
            throw util::exception("short file reading comment");
        disk->metadata["comment"] = util::trim(std::string(comment.data(), comment.size()));
    }

    if (std::accumulate(std::begin(dh.unknown), std::end(dh.unknown), 0) ||
        std::accumulate(std::begin(dh.unknown2), std::end(dh.unknown2), 0))
    {
        Message(msgWarning, "unused header fields contain non-zero values");
    }

    Data data;
    data.reserve(fmt.disk_size());

    auto data_size = fmt.track_size() * dh.used_cyls * fmt.heads;
    while (data.size() < data_size)
    {
        uint16_t ulen;
        if (!file.read(&ulen, sizeof(ulen)))
            throw util::exception("short file reading disk data");

        auto len = static_cast<int16_t>(util::letoh(ulen));
        if (len <= 0)
        {
            uint8_t fill = 0;
            file.read(&fill, sizeof(fill));
            data.insert(data.end(), -len, fill);
        }
        else
        {
            Data block(len);
            file.read(block);
            data.insert(data.end(), block.begin(), block.end());
        }
    }

    auto data_crc = util::le_value(dh.data_crc);
    auto calc_data_crc = crc32(data.data(), data.size());
    if (calc_data_crc != data_crc)
        throw util::exception("invalid data crc");

    if (!file.eof())
        Message(msgWarning, "extra data found at end of file");

    auto desc = util::trim(std::string(dh.description, sizeof(dh.description)));
    if (!desc.empty())
        disk->metadata["description"] = desc;

    auto label = util::trim(std::string(dh.vol_label, sizeof(dh.vol_label)));
    if (!label.empty() && label != "** NONE **")
        disk->metadata["label"] = label;

    if (dh.cyls != dh.used_cyls)
        disk->metadata["used_cyls"] = std::to_string(dh.used_cyls);

    static const char* read_modes[] = { "DOS", "blind", "HFS" };
    if (dh.read_mode < 3)
        disk->metadata["read_mode"] = read_modes[dh.read_mode];

    static const char* drv_types[] = {
        "5.25\" 360KB", "5.25\" 1.2MB", "3.5\" 720KB", "3.5\" 1.44MB", "8\"", "3.5\" 2.88MB" };
    if (dh.drv_type >= 1 && dh.drv_type <= 6)
        disk->metadata["drive"] = drv_types[dh.drv_type - 1];

    auto dos_date = util::le_value(dh.dos_date);
    auto dos_time = util::le_value(dh.dos_time);
    disk->metadata["created"] = FormatTime(dos_date, dos_time);

    data.resize(fmt.disk_size(), fmt.fill);
    disk->format(fmt, data);
    disk->strType = "CQM";

    return true;
}